

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void delete_monster_idx(chunk *c,wchar_t m_idx)

{
  object *poVar1;
  _Bool _Var2;
  loc_conflict lVar3;
  monster_lore_conflict *pmVar4;
  chunk *local_50;
  monster_lore *lore;
  object *next;
  object *obj;
  loc_conflict grid;
  monster *mon;
  wchar_t m_idx_local;
  chunk *c_local;
  
  grid = (loc_conflict)cave_monster((chunk_conflict *)c,m_idx);
  if (m_idx < L'\x01') {
    __assert_fail("m_idx > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x38a,"void delete_monster_idx(struct chunk *, int)");
  }
  _Var2 = square_in_bounds(c,*(loc_conflict *)((long)grid + 0x24));
  if (_Var2) {
    obj = *(object **)((long)grid + 0x24);
    if (*(long *)((long)grid + 8) == 0) {
      *(int *)(*(long *)grid + 0x94) = *(int *)(*(long *)grid + 0x94) + -1;
    }
    else {
      *(int *)(*(long *)((long)grid + 8) + 0x94) = *(int *)(*(long *)((long)grid + 8) + 0x94) + -1;
    }
    _Var2 = flag_has_dbg((bitflag *)(*(long *)grid + 0x5c),0xc,0x17,"mon->race->flags","RF_MULTIPLY"
                        );
    if (_Var2) {
      c->num_repro = c->num_repro + L'\xffffffff';
    }
    if (*(int *)(*(long *)grid + 0x48) != 0) {
      player->upkeep->update = player->upkeep->update | 0xc0;
    }
    lVar3 = (loc_conflict)target_get_monster();
    if (lVar3 == grid) {
      target_set_monster((monster *)0x0);
    }
    if ((loc_conflict)player->upkeep->health_who == grid) {
      health_track(player->upkeep,(monster *)0x0);
    }
    if (*(short *)((long)grid + 0x40) != 0) {
      player_clear_timed(player,L',',true,true);
    }
    square_set_mon(c,(loc_conflict)obj,L'\0');
    monster_remove_from_groups(c,(monster *)grid);
    monster_remove_from_targets(c,(monster *)grid);
    if (*(long *)((long)grid + 0x1d8) != 0) {
      heatmap_free((chunk_conflict *)c,(heatmap)*(uint16_t ***)((long)grid + 0x1d8));
    }
    if (*(long *)((long)grid + 0x1e0) != 0) {
      heatmap_free((chunk_conflict *)c,(heatmap)*(uint16_t ***)((long)grid + 0x1e0));
    }
    next = *(object **)((long)grid + 0x58);
    while (next != (object *)0x0) {
      poVar1 = next->next;
      if ((next->artifact != (artifact *)0x0) && (_Var2 = obj_is_known_artifact(next), !_Var2)) {
        mark_artifact_created(next->artifact,false);
      }
      if (((next->known != (object *)0x0) && (_Var2 = loc_is_zero((loc)next->known->grid), _Var2))
         && (c == (chunk *)cave)) {
        delist_object((chunk_conflict *)player->cave,next->known);
        object_delete((chunk *)player->cave,(chunk *)0x0,&next->known);
      }
      delist_object((chunk_conflict *)c,next);
      if ((player == (player *)0x0) || (c != (chunk *)cave)) {
        local_50 = (chunk *)0x0;
      }
      else {
        local_50 = (chunk *)player->cave;
      }
      object_delete(c,local_50,&next);
      next = poVar1;
    }
    if (*(long *)((long)grid + 0x50) != 0) {
      square_delete_object
                (c,*(loc_conflict *)((long)grid + 0x24),*(object **)((long)grid + 0x50),true,false);
    }
    _Var2 = flag_has_dbg((bitflag *)(*(long *)grid + 0x5c),0xc,2,"mon->race->flags",
                         "RF_PLAYER_GHOST");
    if (_Var2) {
      pmVar4 = get_lore(*(monster_race **)grid);
      pmVar4->sights = 0;
      pmVar4->deaths = 0;
      pmVar4->pkills = 0;
      pmVar4->tkills = 0;
      if (player->upkeep->monster_race == *(monster_race **)grid) {
        player->upkeep->monster_race = (monster_race *)0x0;
      }
      c->ghost->bones_selector = L'\0';
      c->ghost->has_spoken = false;
      c->ghost->string_type = L'\0';
      my_strcpy(c->ghost->string,"",0x50);
    }
    memset((void *)grid,0,0x1f0);
    c->mon_cnt = c->mon_cnt - 1;
    square_light_spot(c,(loc)obj);
    return;
  }
  __assert_fail("square_in_bounds(c, mon->grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x38b,"void delete_monster_idx(struct chunk *, int)");
}

Assistant:

void delete_monster_idx(struct chunk *c, int m_idx)
{
	struct monster *mon = cave_monster(c, m_idx);
	struct loc grid;

	assert(m_idx > 0);
	assert(square_in_bounds(c, mon->grid));
	grid = mon->grid;

	/* Hack -- Reduce the racial counter */
	if (mon->original_race) mon->original_race->cur_num--;
	else mon->race->cur_num--;

	/* Count the number of "reproducers" */
	if (rf_has(mon->race->flags, RF_MULTIPLY)) {
		c->num_repro--;
	}

	/* Affect light? */
	if (mon->race->light != 0)
		player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

	/* Hack -- remove target monster */
	if (target_get_monster() == mon)
		target_set_monster(NULL);

	/* Hack -- remove tracked monster */
	if (player->upkeep->health_who == mon)
		health_track(player->upkeep, NULL);

	/* Hack -- remove any command status */
	if (mon->m_timed[MON_TMD_COMMAND]) {
		(void) player_clear_timed(player, TMD_COMMAND, true, true);
	}

	/* Monster is gone from square and group, and no longer targeted */
	square_set_mon(c, grid, 0);
	monster_remove_from_groups(c, mon);
	monster_remove_from_targets(c, mon);

	/* Free any heatmaps */
	if (mon->noise.grids) {
		heatmap_free(c, mon->noise);
	}
	if (mon->scent.grids) {
		heatmap_free(c, mon->scent);
	}

	/* Delete objects */
	struct object *obj = mon->held_obj;
	while (obj) {
		struct object *next = obj->next;

		/* Preserve unseen artifacts (we assume they were created as this
		 * monster's drop) - this will cause unintended behaviour in preserve
		 * off mode if monsters can pick up artifacts */
		if (obj->artifact && !obj_is_known_artifact(obj)) {
			mark_artifact_created(obj->artifact, false);
		}

		/* Delete the object.  Since it's in the cave's list do
		 * some additional bookkeeping. */
		if (obj->known) {
			/* It's not in a floor pile so remove it completely.
			 * Once compatibility with old savefiles isn't needed
			 * can skip the test and simply delist and delete
			 * since any obj->known from a monster's inventory
			 * will not be in a floor pile. */
			if (loc_is_zero(obj->known->grid) && (c == cave)) {
				delist_object(player->cave, obj->known);
				object_delete(player->cave, NULL, &obj->known);
			}
		}
		delist_object(c, obj);
		object_delete(c, (player && c == cave) ? player->cave : NULL,
			&obj);
		obj = next;
	}

	/* Delete mimicked objects */
	if (mon->mimicked_obj) {
		square_delete_object(c, mon->grid, mon->mimicked_obj, true, false);
	}

	/* If the monster was a player ghost, remove it from the monster memory,
	 * ensure that it never appears again, clear its data and allow the
	 * next ghost to speak. */
	if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		struct monster_lore *lore = get_lore(mon->race);
		lore->sights = 0;
		lore->deaths = 0;
		lore->pkills = 0;
		lore->tkills = 0;
		if (player->upkeep->monster_race == mon->race) {
			player->upkeep->monster_race = NULL;
		}
		c->ghost->bones_selector = 0;
		c->ghost->has_spoken = false;
		c->ghost->string_type = 0;
		my_strcpy(c->ghost->string, "", sizeof(c->ghost->string));
	}

	/* Wipe the Monster */
	memset(mon, 0, sizeof(struct monster));

	/* Count monsters */
	c->mon_cnt--;

	/* Visual update */
	square_light_spot(c, grid);
}